

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O2

int read_markers(j_decompress_ptr cinfo)

{
  byte bVar1;
  byte bVar2;
  JOCTET JVar3;
  JOCTET JVar4;
  byte bVar5;
  jpeg_source_mgr *pjVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  boolean bVar26;
  int iVar27;
  jpeg_error_mgr *pjVar28;
  JHUFF_TBL *pJVar29;
  JQUANT_TBL *pJVar30;
  JHUFF_TBL **ppJVar31;
  ulong uVar32;
  boolean is_arith;
  UINT16 UVar33;
  size_t sVar34;
  JOCTET *pJVar35;
  long lVar36;
  uint uVar37;
  uint uVar38;
  byte *pbVar39;
  long lVar40;
  ulong uVar41;
  byte *pbVar42;
  jpeg_component_info *pjVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  size_t local_180;
  UINT8 bits [17];
  byte local_138 [264];
  
  uVar38 = cinfo->unread_marker;
LAB_00121e27:
  if (uVar38 == 0) {
    if (cinfo->marker->saw_SOI == 0) {
      pjVar6 = cinfo->src;
      sVar34 = pjVar6->bytes_in_buffer;
      if (sVar34 == 0) {
        bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar26 == 0) {
          return 0;
        }
        sVar34 = pjVar6->bytes_in_buffer;
      }
      bVar1 = *pjVar6->next_input_byte;
      sVar34 = sVar34 - 1;
      if (sVar34 == 0) {
        bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar26 == 0) {
          return 0;
        }
        pbVar39 = pjVar6->next_input_byte;
        sVar34 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar39 = pjVar6->next_input_byte + 1;
      }
      bVar2 = *pbVar39;
      uVar38 = (uint)bVar2;
      if (bVar2 != 0xd8 || bVar1 != 0xff) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0x35;
        *(uint *)&pjVar28->msg_parm = (uint)bVar1;
        *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)bVar2;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      cinfo->unread_marker = (uint)bVar2;
      pjVar6->next_input_byte = pbVar39 + 1;
      pjVar6->bytes_in_buffer = sVar34 - 1;
    }
    else {
      bVar26 = next_marker(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      uVar38 = cinfo->unread_marker;
    }
  }
  switch(uVar38) {
  case 0xc0:
  case 0xc1:
    bVar26 = 0;
    goto LAB_00121fc6;
  case 0xc2:
    bVar26 = 1;
LAB_00121fc6:
    is_arith = 0;
LAB_0012210f:
    bVar26 = get_sof(cinfo,bVar26,is_arith);
    if (bVar26 == 0) {
      return 0;
    }
    break;
  case 0xc3:
  case 0xc5:
  case 0xc6:
  case 199:
  case 200:
  case 0xcb:
  case 0xcd:
  case 0xce:
  case 0xcf:
    pjVar28 = cinfo->err;
    pjVar28->msg_code = 0x3c;
    goto LAB_00121f30;
  case 0xc4:
    pjVar6 = cinfo->src;
    sVar34 = pjVar6->bytes_in_buffer;
    if (sVar34 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      sVar34 = pjVar6->bytes_in_buffer;
    }
    bVar1 = *pjVar6->next_input_byte;
    sVar34 = sVar34 - 1;
    if (sVar34 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      pbVar39 = pjVar6->next_input_byte;
      sVar34 = pjVar6->bytes_in_buffer;
    }
    else {
      pbVar39 = pjVar6->next_input_byte + 1;
    }
    sVar34 = sVar34 - 1;
    pbVar42 = pbVar39 + 1;
    for (lVar36 = (ulong)bVar1 * 0x100 + (ulong)*pbVar39 + -2; 0x10 < lVar36;
        lVar36 = (lVar36 + -0x11) - uVar41) {
      if (sVar34 == 0) {
        bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar26 == 0) {
          return 0;
        }
        pbVar42 = pjVar6->next_input_byte;
        sVar34 = pjVar6->bytes_in_buffer;
      }
      bVar1 = *pbVar42;
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x50;
      uVar38 = (uint)bVar1;
      (pjVar28->msg_parm).i[0] = uVar38;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      bits[0] = '\0';
      uVar41 = 0;
      lVar40 = 1;
      while( true ) {
        pbVar42 = pbVar42 + 1;
        sVar34 = sVar34 - 1;
        uVar37 = (uint)uVar41;
        if (lVar40 == 0x11) break;
        if (sVar34 == 0) {
          bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
          if (bVar26 == 0) {
            return 0;
          }
          pbVar42 = pjVar6->next_input_byte;
          sVar34 = pjVar6->bytes_in_buffer;
        }
        bVar2 = *pbVar42;
        bits[lVar40] = bVar2;
        uVar41 = (ulong)(uVar37 + bVar2);
        lVar40 = lVar40 + 1;
      }
      pjVar28 = cinfo->err;
      auVar12[0xc] = SUB41(bits._1_4_,3);
      auVar12._0_12_ = ZEXT712(0);
      auVar24[1] = 0;
      auVar24[0] = SUB41(bits._1_4_,2);
      auVar24._2_3_ = auVar12._10_3_;
      auVar24._5_8_ = 0;
      auVar44[5] = 0;
      auVar44[4] = SUB41(bits._1_4_,1);
      auVar44._6_7_ = SUB137(auVar24 << 0x40,6);
      auVar44._0_4_ = bits._1_4_ & 0xff;
      auVar44._13_3_ = 0;
      *(undefined1 (*) [16])&pjVar28->msg_parm = auVar44;
      uVar32 = (ulong)(ushort)bits._5_4_ & 0xffffffffffff00ff;
      auVar13._8_4_ = 0;
      auVar13._0_8_ = uVar32;
      auVar13[0xc] = SUB41(bits._5_4_,3);
      auVar14[8] = SUB41(bits._5_4_,2);
      auVar14._0_8_ = uVar32;
      auVar14[9] = 0;
      auVar14._10_3_ = auVar13._10_3_;
      auVar20._5_8_ = 0;
      auVar20._0_5_ = auVar14._8_5_;
      auVar45._0_4_ = (undefined4)uVar32;
      auVar15[4] = SUB41(bits._5_4_,1);
      auVar15._0_4_ = auVar45._0_4_;
      auVar15[5] = 0;
      auVar15._6_7_ = SUB137(auVar20 << 0x40,6);
      auVar45._4_9_ = auVar15._4_9_;
      auVar45._13_3_ = 0;
      *(undefined1 (*) [16])((long)&pjVar28->msg_parm + 0x10) = auVar45;
      pjVar28->msg_code = 0x56;
      (*pjVar28->emit_message)((j_common_ptr)cinfo,2);
      pjVar28 = cinfo->err;
      auVar16[0xc] = SUB41(bits._9_4_,3);
      auVar16._0_12_ = ZEXT712(0);
      auVar25[1] = 0;
      auVar25[0] = SUB41(bits._9_4_,2);
      auVar25._2_3_ = auVar16._10_3_;
      auVar25._5_8_ = 0;
      auVar46[5] = 0;
      auVar46[4] = SUB41(bits._9_4_,1);
      auVar46._6_7_ = SUB137(auVar25 << 0x40,6);
      auVar46._0_4_ = bits._9_4_ & 0xff;
      auVar46._13_3_ = 0;
      *(undefined1 (*) [16])&pjVar28->msg_parm = auVar46;
      uVar32 = (ulong)(ushort)bits._13_4_ & 0xffffffffffff00ff;
      auVar17._8_4_ = 0;
      auVar17._0_8_ = uVar32;
      auVar17[0xc] = SUB41(bits._13_4_,3);
      auVar18[8] = SUB41(bits._13_4_,2);
      auVar18._0_8_ = uVar32;
      auVar18[9] = 0;
      auVar18._10_3_ = auVar17._10_3_;
      auVar21._5_8_ = 0;
      auVar21._0_5_ = auVar18._8_5_;
      auVar47._0_4_ = (undefined4)uVar32;
      auVar19[4] = SUB41(bits._13_4_,1);
      auVar19._0_4_ = auVar47._0_4_;
      auVar19[5] = 0;
      auVar19._6_7_ = SUB137(auVar21 << 0x40,6);
      auVar47._4_9_ = auVar19._4_9_;
      auVar47._13_3_ = 0;
      *(undefined1 (*) [16])((long)&pjVar28->msg_parm + 0x10) = auVar47;
      pjVar28->msg_code = 0x56;
      (*pjVar28->emit_message)((j_common_ptr)cinfo,2);
      if ((0x100 < uVar37) || (lVar36 + -0x11 < (long)uVar41)) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 8;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      for (uVar32 = 0; uVar41 != uVar32; uVar32 = uVar32 + 1) {
        if (sVar34 == 0) {
          bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
          if (bVar26 == 0) {
            return 0;
          }
          pbVar42 = pjVar6->next_input_byte;
          sVar34 = pjVar6->bytes_in_buffer;
        }
        sVar34 = sVar34 - 1;
        bVar2 = *pbVar42;
        pbVar42 = pbVar42 + 1;
        local_138[uVar32] = bVar2;
      }
      memset(local_138 + uVar41,0,(long)(int)(0x100 - uVar37));
      if ((bVar1 & 0x10) == 0) {
        ppJVar31 = cinfo->dc_huff_tbl_ptrs;
        if (3 < bVar1) {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x1e;
          (pjVar28->msg_parm).i[0] = uVar38;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
      }
      else {
        uVar38 = uVar38 - 0x10;
        ppJVar31 = cinfo->ac_huff_tbl_ptrs;
        if (0x13 < bVar1) {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x1e;
          (pjVar28->msg_parm).i[0] = uVar38;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
      }
      ppJVar31 = ppJVar31 + uVar38;
      pJVar29 = *ppJVar31;
      if (pJVar29 == (JHUFF_TBL *)0x0) {
        pJVar29 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
        *ppJVar31 = pJVar29;
      }
      pJVar29->bits[0x10] = bits[0x10];
      *(ulong *)pJVar29->bits = CONCAT35(bits._5_3_,CONCAT41(bits._1_4_,bits[0]));
      *(ulong *)(pJVar29->bits + 8) = CONCAT35(bits._13_3_,CONCAT41(bits._9_4_,bits[8]));
      memcpy((*ppJVar31)->huffval,local_138,0x100);
    }
    if (lVar36 != 0) {
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0xb;
      (*pjVar28->error_exit)((j_common_ptr)cinfo);
    }
    pjVar6->next_input_byte = pbVar42;
    pjVar6->bytes_in_buffer = sVar34;
    break;
  case 0xc9:
    bVar26 = 0;
    is_arith = 1;
    goto LAB_0012210f;
  case 0xca:
    iVar27 = get_sof(cinfo,1,1);
    goto LAB_00121f19;
  case 0xcc:
    pjVar6 = cinfo->src;
    sVar34 = pjVar6->bytes_in_buffer;
    if (sVar34 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      sVar34 = pjVar6->bytes_in_buffer;
    }
    JVar3 = *pjVar6->next_input_byte;
    sVar34 = sVar34 - 1;
    if (sVar34 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      pbVar39 = pjVar6->next_input_byte;
      sVar34 = pjVar6->bytes_in_buffer;
    }
    else {
      pbVar39 = pjVar6->next_input_byte + 1;
    }
    uVar41 = (ulong)CONCAT11(JVar3,*pbVar39);
    while( true ) {
      pbVar39 = pbVar39 + 1;
      sVar34 = sVar34 - 1;
      if (uVar41 < 3) break;
      if (sVar34 == 0) {
        bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar26 == 0) {
          return 0;
        }
        pbVar39 = pjVar6->next_input_byte;
        sVar34 = pjVar6->bytes_in_buffer;
      }
      bVar1 = *pbVar39;
      sVar34 = sVar34 - 1;
      if (sVar34 == 0) {
        bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar26 == 0) {
          return 0;
        }
        pbVar39 = pjVar6->next_input_byte;
        sVar34 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar39 = pbVar39 + 1;
      }
      bVar2 = *pbVar39;
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x4f;
      uVar38 = (uint)bVar1;
      (pjVar28->msg_parm).i[0] = uVar38;
      (cinfo->err->msg_parm).i[1] = (uint)bVar2;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      if (bVar1 < 0x20) {
        if (0xf < bVar1) goto LAB_001226d2;
        cinfo->arith_dc_L[uVar38] = bVar2 & 0xf;
        cinfo->arith_dc_U[uVar38] = bVar2 >> 4;
        if (bVar2 >> 4 < (bVar2 & 0xf)) {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x1d;
          (pjVar28->msg_parm).i[0] = (uint)bVar2;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
      }
      else {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0x1c;
        (pjVar28->msg_parm).i[0] = (uint)bVar1;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_001226d2:
        cinfo->arith_ac_K[bVar1 - 0x10] = bVar2;
      }
      uVar41 = uVar41 - 2;
    }
    if (uVar41 != 2) {
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0xb;
      (*pjVar28->error_exit)((j_common_ptr)cinfo);
    }
    pjVar6->next_input_byte = pbVar39;
    pjVar6->bytes_in_buffer = sVar34;
    break;
  case 0xd0:
  case 0xd1:
  case 0xd2:
  case 0xd3:
  case 0xd4:
  case 0xd5:
  case 0xd6:
  case 0xd7:
    goto switchD_00121f01_caseD_d0;
  case 0xd8:
    pjVar28 = cinfo->err;
    pjVar28->msg_code = 0x66;
    (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
    if (cinfo->marker->saw_SOI != 0) {
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x3d;
      (*pjVar28->error_exit)((j_common_ptr)cinfo);
    }
    for (lVar36 = -0x10; lVar36 != 0; lVar36 = lVar36 + 1) {
      cinfo->arith_dc_U[lVar36] = '\0';
      cinfo->arith_ac_K[lVar36] = '\x01';
      cinfo->arith_ac_K[lVar36 + 0x10] = '\x05';
    }
    cinfo->restart_interval = 0;
    cinfo->saw_JFIF_marker = 0;
    cinfo->jpeg_color_space = JCS_UNKNOWN;
    cinfo->CCIR601_sampling = 0;
    cinfo->JFIF_major_version = '\x01';
    cinfo->JFIF_minor_version = '\x01';
    cinfo->density_unit = '\0';
    cinfo->X_density = 1;
    cinfo->Y_density = 1;
    cinfo->saw_Adobe_marker = 0;
    cinfo->Adobe_transform = '\0';
    cinfo->marker->saw_SOI = 1;
    break;
  case 0xd9:
    pjVar28 = cinfo->err;
    pjVar28->msg_code = 0x55;
    (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
    cinfo->unread_marker = 0;
    return 2;
  case 0xda:
    pjVar6 = cinfo->src;
    pJVar35 = pjVar6->next_input_byte;
    local_180 = pjVar6->bytes_in_buffer;
    if (cinfo->marker->saw_SOF == 0) {
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x3e;
      (*pjVar28->error_exit)((j_common_ptr)cinfo);
    }
    if (local_180 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      pJVar35 = pjVar6->next_input_byte;
      local_180 = pjVar6->bytes_in_buffer;
    }
    JVar3 = *pJVar35;
    local_180 = local_180 - 1;
    if (local_180 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      pJVar35 = pjVar6->next_input_byte;
      local_180 = pjVar6->bytes_in_buffer;
    }
    else {
      pJVar35 = pJVar35 + 1;
    }
    JVar4 = *pJVar35;
    local_180 = local_180 - 1;
    if (local_180 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      pbVar39 = pjVar6->next_input_byte;
      local_180 = pjVar6->bytes_in_buffer;
    }
    else {
      pbVar39 = pJVar35 + 1;
    }
    bVar1 = *pbVar39;
    pjVar28 = cinfo->err;
    pjVar28->msg_code = 0x67;
    (pjVar28->msg_parm).i[0] = (uint)bVar1;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    if ((CONCAT11(JVar3,JVar4) != (ushort)((ushort)bVar1 * 2 + 6)) || ((byte)(bVar1 - 5) < 0xfc)) {
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0xb;
      (*pjVar28->error_exit)((j_common_ptr)cinfo);
    }
    cinfo->comps_in_scan = (uint)bVar1;
    for (lVar36 = 0x37; lVar36 != 0x3b; lVar36 = lVar36 + 1) {
      (&cinfo->err)[lVar36] = (jpeg_error_mgr *)0x0;
    }
    uVar41 = 0;
    do {
      pbVar39 = pbVar39 + 1;
      local_180 = local_180 - 1;
      if (uVar41 == bVar1) {
        if (local_180 == 0) {
          bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
          if (bVar26 == 0) {
            return 0;
          }
          pbVar39 = pjVar6->next_input_byte;
          local_180 = pjVar6->bytes_in_buffer;
        }
        cinfo->Ss = (uint)*pbVar39;
        local_180 = local_180 - 1;
        if (local_180 == 0) {
          bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
          if (bVar26 == 0) {
            return 0;
          }
          pbVar39 = pjVar6->next_input_byte;
          local_180 = pjVar6->bytes_in_buffer;
        }
        else {
          pbVar39 = pbVar39 + 1;
        }
        cinfo->Se = (uint)*pbVar39;
        local_180 = local_180 - 1;
        if (local_180 == 0) {
          bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
          if (bVar26 == 0) {
            return 0;
          }
          pbVar39 = pjVar6->next_input_byte;
          local_180 = pjVar6->bytes_in_buffer;
        }
        else {
          pbVar39 = pbVar39 + 1;
        }
        bVar1 = *pbVar39;
        cinfo->Ah = (uint)(bVar1 >> 4);
        cinfo->Al = bVar1 & 0xf;
        pjVar28 = cinfo->err;
        (pjVar28->msg_parm).i[0] = cinfo->Ss;
        (pjVar28->msg_parm).i[1] = cinfo->Se;
        (pjVar28->msg_parm).i[2] = cinfo->Ah;
        (pjVar28->msg_parm).i[3] = cinfo->Al;
        pjVar28->msg_code = 0x69;
        (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
        cinfo->marker->next_restart_num = 0;
        cinfo->input_scan_number = cinfo->input_scan_number + 1;
        pjVar6->next_input_byte = pbVar39 + 1;
        pjVar6->bytes_in_buffer = local_180 - 1;
        cinfo->unread_marker = 0;
        return 1;
      }
      if (local_180 == 0) {
        bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar26 == 0) {
          return 0;
        }
        pbVar39 = pjVar6->next_input_byte;
        local_180 = pjVar6->bytes_in_buffer;
      }
      bVar2 = *pbVar39;
      local_180 = local_180 - 1;
      if (local_180 == 0) {
        bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar26 == 0) {
          return 0;
        }
        pbVar39 = pjVar6->next_input_byte;
        local_180 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar39 = pbVar39 + 1;
      }
      bVar5 = *pbVar39;
      pjVar43 = cinfo->comp_info;
      for (uVar32 = 0;
          (uVar38 = (uint)bVar2, uVar32 < 4 && ((long)uVar32 < (long)cinfo->num_components));
          uVar32 = uVar32 + 1) {
        if ((pjVar43->component_id == uVar38) &&
           (cinfo->cur_comp_info[uVar32] == (jpeg_component_info *)0x0)) goto LAB_00122a08;
        pjVar43 = pjVar43 + 1;
      }
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 5;
      (pjVar28->msg_parm).i[0] = uVar38;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_00122a08:
      cinfo->cur_comp_info[uVar41] = pjVar43;
      pjVar43->dc_tbl_no = (uint)(bVar5 >> 4);
      pjVar43->ac_tbl_no = bVar5 & 0xf;
      pjVar28 = cinfo->err;
      (pjVar28->msg_parm).i[0] = uVar38;
      (pjVar28->msg_parm).i[1] = pjVar43->dc_tbl_no;
      (pjVar28->msg_parm).i[2] = pjVar43->ac_tbl_no;
      pjVar28->msg_code = 0x68;
      (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
      for (uVar32 = 0; uVar41 != uVar32; uVar32 = uVar32 + 1) {
        if (pjVar43 == cinfo->cur_comp_info[uVar32]) {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 5;
          (pjVar28->msg_parm).i[0] = uVar38;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
      }
      uVar41 = uVar41 + 1;
    } while( true );
  case 0xdb:
    pjVar6 = cinfo->src;
    sVar34 = pjVar6->bytes_in_buffer;
    if (sVar34 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      sVar34 = pjVar6->bytes_in_buffer;
    }
    bVar1 = *pjVar6->next_input_byte;
    sVar34 = sVar34 - 1;
    if (sVar34 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      pbVar39 = pjVar6->next_input_byte;
      sVar34 = pjVar6->bytes_in_buffer;
    }
    else {
      pbVar39 = pjVar6->next_input_byte + 1;
    }
    sVar34 = sVar34 - 1;
    pbVar42 = pbVar39 + 1;
    for (lVar36 = (ulong)bVar1 * 0x100 + (ulong)*pbVar39 + -2; 0 < lVar36;
        lVar36 = lVar36 + (ulong)(bVar1 < 0x10) * 0x40 + -0x81) {
      if (sVar34 == 0) {
        bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar26 == 0) {
          return 0;
        }
        pbVar42 = pjVar6->next_input_byte;
        sVar34 = pjVar6->bytes_in_buffer;
      }
      bVar1 = *pbVar42;
      uVar38 = bVar1 & 0xf;
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x51;
      (pjVar28->msg_parm).i[0] = uVar38;
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)(bVar1 >> 4);
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      if (3 < uVar38) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0x1f;
        (pjVar28->msg_parm).i[0] = uVar38;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      pJVar30 = cinfo->quant_tbl_ptrs[uVar38];
      if (pJVar30 == (JQUANT_TBL *)0x0) {
        pJVar30 = jpeg_alloc_quant_table((j_common_ptr)cinfo);
        cinfo->quant_tbl_ptrs[uVar38] = pJVar30;
      }
      lVar40 = 0;
      while( true ) {
        sVar34 = sVar34 - 1;
        pbVar42 = pbVar42 + 1;
        if (lVar40 == 0x40) break;
        if (bVar1 < 0x10) {
          if (sVar34 == 0) {
            bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar26 == 0) {
              return 0;
            }
            pbVar42 = pjVar6->next_input_byte;
            sVar34 = pjVar6->bytes_in_buffer;
          }
          UVar33 = (UINT16)*pbVar42;
        }
        else {
          if (sVar34 == 0) {
            bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar26 == 0) {
              return 0;
            }
            pbVar42 = pjVar6->next_input_byte;
            sVar34 = pjVar6->bytes_in_buffer;
          }
          bVar2 = *pbVar42;
          sVar34 = sVar34 - 1;
          if (sVar34 == 0) {
            bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar26 == 0) {
              return 0;
            }
            pbVar42 = pjVar6->next_input_byte;
            sVar34 = pjVar6->bytes_in_buffer;
          }
          else {
            pbVar42 = pbVar42 + 1;
          }
          UVar33 = CONCAT11(bVar2,*pbVar42);
        }
        pJVar30->quantval[jpeg_natural_order[lVar40]] = UVar33;
        lVar40 = lVar40 + 1;
      }
      if (1 < cinfo->err->trace_level) {
        for (uVar41 = 0; uVar41 < 0x40; uVar41 = uVar41 + 8) {
          pjVar28 = cinfo->err;
          uVar32 = *(ulong *)(pJVar30->quantval + uVar41);
          auVar8._8_4_ = 0;
          auVar8._0_8_ = uVar32;
          auVar8._12_2_ = (short)(uVar32 >> 0x30);
          auVar10._8_2_ = (short)(uVar32 >> 0x20);
          auVar10._0_8_ = uVar32;
          auVar10._10_4_ = auVar8._10_4_;
          auVar22._6_8_ = 0;
          auVar22._0_6_ = auVar10._8_6_;
          auVar48._6_8_ = SUB148(auVar22 << 0x40,6);
          auVar48._4_2_ = (short)(uVar32 >> 0x10);
          auVar48._0_2_ = (ushort)uVar32;
          auVar48._2_2_ = 0;
          auVar48._14_2_ = 0;
          *(undefined1 (*) [16])&pjVar28->msg_parm = auVar48;
          uVar32 = *(ulong *)(pJVar30->quantval + uVar41 + 4);
          auVar7._8_4_ = 0;
          auVar7._0_8_ = uVar32;
          auVar7._12_2_ = (short)(uVar32 >> 0x30);
          auVar9._8_2_ = (short)(uVar32 >> 0x20);
          auVar9._0_8_ = uVar32;
          auVar9._10_4_ = auVar7._10_4_;
          auVar23._6_8_ = 0;
          auVar23._0_6_ = auVar9._8_6_;
          auVar11._4_2_ = (short)(uVar32 >> 0x10);
          auVar11._0_4_ = (uint)uVar32;
          auVar11._6_8_ = SUB148(auVar23 << 0x40,6);
          auVar49._0_4_ = (uint)uVar32 & 0xffff;
          auVar49._4_10_ = auVar11._4_10_;
          auVar49._14_2_ = 0;
          *(undefined1 (*) [16])((long)&pjVar28->msg_parm + 0x10) = auVar49;
          pjVar28->msg_code = 0x5d;
          (*pjVar28->emit_message)((j_common_ptr)cinfo,2);
        }
      }
    }
    if (lVar36 != 0) {
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0xb;
      (*pjVar28->error_exit)((j_common_ptr)cinfo);
    }
    pjVar6->next_input_byte = pbVar42;
    pjVar6->bytes_in_buffer = sVar34;
    break;
  case 0xdc:
    iVar27 = skip_variable(cinfo);
    goto LAB_00121f19;
  case 0xdd:
    pjVar6 = cinfo->src;
    sVar34 = pjVar6->bytes_in_buffer;
    if (sVar34 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      sVar34 = pjVar6->bytes_in_buffer;
    }
    JVar3 = *pjVar6->next_input_byte;
    sVar34 = sVar34 - 1;
    if (sVar34 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      pJVar35 = pjVar6->next_input_byte;
      sVar34 = pjVar6->bytes_in_buffer;
    }
    else {
      pJVar35 = pjVar6->next_input_byte + 1;
    }
    if (CONCAT11(JVar3,*pJVar35) != 4) {
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0xb;
      (*pjVar28->error_exit)((j_common_ptr)cinfo);
    }
    sVar34 = sVar34 - 1;
    if (sVar34 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      pJVar35 = pjVar6->next_input_byte;
      sVar34 = pjVar6->bytes_in_buffer;
    }
    else {
      pJVar35 = pJVar35 + 1;
    }
    JVar3 = *pJVar35;
    sVar34 = sVar34 - 1;
    if (sVar34 == 0) {
      bVar26 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar26 == 0) {
        return 0;
      }
      pJVar35 = pjVar6->next_input_byte;
      sVar34 = pjVar6->bytes_in_buffer;
    }
    else {
      pJVar35 = pJVar35 + 1;
    }
    JVar4 = *pJVar35;
    pjVar28 = cinfo->err;
    pjVar28->msg_code = 0x52;
    (pjVar28->msg_parm).i[0] = (uint)CONCAT11(JVar3,JVar4);
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    cinfo->restart_interval = (uint)CONCAT11(JVar3,JVar4);
    pjVar6->next_input_byte = pJVar35 + 1;
    pjVar6->bytes_in_buffer = sVar34 - 1;
    break;
  case 0xde:
  case 0xdf:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf3:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
  case 0xf8:
  case 0xf9:
  case 0xfa:
  case 0xfb:
  case 0xfc:
  case 0xfd:
switchD_00121f01_caseD_de:
    pjVar28 = cinfo->err;
    pjVar28->msg_code = 0x44;
LAB_00121f30:
    (pjVar28->msg_parm).i[0] = uVar38;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    break;
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe3:
  case 0xe4:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
    iVar27 = (*(&cinfo->marker[1].read_markers)[uVar38 - 0xe0])(cinfo);
    goto LAB_00121f19;
  case 0xfe:
    iVar27 = (*cinfo->marker[1].reset_marker_reader)(cinfo);
LAB_00121f19:
    if (iVar27 == 0) {
      return 0;
    }
    break;
  default:
    if (uVar38 != 1) goto switchD_00121f01_caseD_de;
    goto switchD_00121f01_caseD_d0;
  }
LAB_001227c0:
  cinfo->unread_marker = 0;
  uVar38 = 0;
  goto LAB_00121e27;
switchD_00121f01_caseD_d0:
  pjVar28 = cinfo->err;
  pjVar28->msg_code = 0x5c;
  (pjVar28->msg_parm).i[0] = uVar38;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  goto LAB_001227c0;
}

Assistant:

METHODDEF(int)
read_markers(j_decompress_ptr cinfo)
{
  /* Outer loop repeats once for each marker. */
  for (;;) {
    /* Collect the marker proper, unless we already did. */
    /* NB: first_marker() enforces the requirement that SOI appear first. */
    if (cinfo->unread_marker == 0) {
      if (!cinfo->marker->saw_SOI) {
        if (!first_marker(cinfo))
          return JPEG_SUSPENDED;
      } else {
        if (!next_marker(cinfo))
          return JPEG_SUSPENDED;
      }
    }
    /* At this point cinfo->unread_marker contains the marker code and the
     * input point is just past the marker proper, but before any parameters.
     * A suspension will cause us to return with this state still true.
     */
    switch (cinfo->unread_marker) {
    case M_SOI:
      if (!get_soi(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_SOF0:                /* Baseline */
    case M_SOF1:                /* Extended sequential, Huffman */
      if (!get_sof(cinfo, FALSE, FALSE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF2:                /* Progressive, Huffman */
      if (!get_sof(cinfo, TRUE, FALSE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF9:                /* Extended sequential, arithmetic */
      if (!get_sof(cinfo, FALSE, TRUE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF10:               /* Progressive, arithmetic */
      if (!get_sof(cinfo, TRUE, TRUE))
        return JPEG_SUSPENDED;
      break;

    /* Currently unsupported SOFn types */
    case M_SOF3:                /* Lossless, Huffman */
    case M_SOF5:                /* Differential sequential, Huffman */
    case M_SOF6:                /* Differential progressive, Huffman */
    case M_SOF7:                /* Differential lossless, Huffman */
    case M_JPG:                 /* Reserved for JPEG extensions */
    case M_SOF11:               /* Lossless, arithmetic */
    case M_SOF13:               /* Differential sequential, arithmetic */
    case M_SOF14:               /* Differential progressive, arithmetic */
    case M_SOF15:               /* Differential lossless, arithmetic */
      ERREXIT1(cinfo, JERR_SOF_UNSUPPORTED, cinfo->unread_marker);
      break;

    case M_SOS:
      if (!get_sos(cinfo))
        return JPEG_SUSPENDED;
      cinfo->unread_marker = 0; /* processed the marker */
      return JPEG_REACHED_SOS;

    case M_EOI:
      TRACEMS(cinfo, 1, JTRC_EOI);
      cinfo->unread_marker = 0; /* processed the marker */
      return JPEG_REACHED_EOI;

    case M_DAC:
      if (!get_dac(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DHT:
      if (!get_dht(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DQT:
      if (!get_dqt(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DRI:
      if (!get_dri(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_APP0:
    case M_APP1:
    case M_APP2:
    case M_APP3:
    case M_APP4:
    case M_APP5:
    case M_APP6:
    case M_APP7:
    case M_APP8:
    case M_APP9:
    case M_APP10:
    case M_APP11:
    case M_APP12:
    case M_APP13:
    case M_APP14:
    case M_APP15:
      if (!(*((my_marker_ptr)cinfo->marker)->process_APPn[
               cinfo->unread_marker - (int)M_APP0]) (cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_COM:
      if (!(*((my_marker_ptr)cinfo->marker)->process_COM) (cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_RST0:                /* these are all parameterless */
    case M_RST1:
    case M_RST2:
    case M_RST3:
    case M_RST4:
    case M_RST5:
    case M_RST6:
    case M_RST7:
    case M_TEM:
      TRACEMS1(cinfo, 1, JTRC_PARMLESS_MARKER, cinfo->unread_marker);
      break;

    case M_DNL:                 /* Ignore DNL ... perhaps the wrong thing */
      if (!skip_variable(cinfo))
        return JPEG_SUSPENDED;
      break;

    default:                    /* must be DHP, EXP, JPGn, or RESn */
      /* For now, we treat the reserved markers as fatal errors since they are
       * likely to be used to signal incompatible JPEG Part 3 extensions.
       * Once the JPEG 3 version-number marker is well defined, this code
       * ought to change!
       */
      ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
      break;
    }
    /* Successfully processed marker, so reset state variable */
    cinfo->unread_marker = 0;
  } /* end loop */
}